

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O1

bool __thiscall
S2MinDistanceEdgeTarget::VisitContainingShapes
          (S2MinDistanceEdgeTarget *this,S2ShapeIndex *index,ShapeVisitor *visitor)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  S2MinDistancePointTarget local_30;
  
  dVar3 = (this->a_).c_[0] + (this->b_).c_[0];
  dVar4 = (this->a_).c_[1] + (this->b_).c_[1];
  dVar5 = (this->a_).c_[2] + (this->b_).c_[2];
  dVar2 = dVar5 * dVar5 + dVar4 * dVar4 + dVar3 * dVar3;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  local_30.point_.c_[2] =
       (VType)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
              (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
  local_30.point_.c_[0] = dVar3 * local_30.point_.c_[2];
  local_30.point_.c_[1] = dVar4 * local_30.point_.c_[2];
  local_30.point_.c_[2] = dVar5 * local_30.point_.c_[2];
  local_30.super_S2MinDistanceTarget._vptr_S2DistanceTarget =
       (_func_int **)&PTR__S2DistanceTarget_002c29a0;
  bVar1 = S2MinDistancePointTarget::VisitContainingShapes(&local_30,index,visitor);
  return bVar1;
}

Assistant:

bool S2MinDistanceEdgeTarget::VisitContainingShapes(
    const S2ShapeIndex& index, const ShapeVisitor& visitor) {
  // We test the center of the edge in order to ensure that edge targets AB
  // and BA yield identical results (which is not guaranteed by the API but
  // users might expect).  Other options would be to test both endpoints, or
  // return different results for AB and BA in some cases.
  S2MinDistancePointTarget target((a_ + b_).Normalize());
  return target.VisitContainingShapes(index, visitor);
}